

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclstubs.c
# Opt level: O3

Integer pnga_spd_invert(Integer g_a)

{
  pnga_error("ga_lu_solve:scalapack not interfaced",0);
  return 0;
}

Assistant:

Integer pnga_spd_invert(Integer g_a) {
#if HAVE_SCALAPACK
#   if ENABLE_F77
    Integer gai_spd_invert_(Integer *g_a);
    return gai_spd_invert_(&g_a);
#   else
    pnga_error("ga_lu_solve:scalapack interfaced, need configure --enable-f77",0L);
    return FALSE;
#   endif
#else
    pnga_error("ga_lu_solve:scalapack not interfaced",0L);
    return FALSE;
#endif
}